

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
moveAppend(QGenericArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *this,
          pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *b,
          pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *e)

{
  qsizetype *pqVar1;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *ptVar3;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar4;
  long lVar5;
  quintptr qVar6;
  Mapping *pMVar7;
  int iVar8;
  int iVar9;
  
  if (b != e) {
    ppVar4 = (this->
             super_QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
             ).ptr;
    for (; b < e; b = b + 1) {
      lVar5 = (this->
              super_QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
              ).size;
      iVar8 = (b->first).r;
      iVar9 = (b->first).c;
      qVar6 = (b->first).i;
      pMVar7 = b->second;
      ptVar3 = &ppVar4[lVar5].first.m;
      ptVar3->ptr = (b->first).m.ptr;
      ptVar3[1] = (totally_ordered_wrapper<const_QAbstractItemModel_*>)pMVar7;
      ppVar2 = ppVar4 + lVar5;
      (ppVar2->first).r = iVar8;
      (ppVar2->first).c = iVar9;
      (ppVar2->first).i = qVar6;
      pqVar1 = &(this->
                super_QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                ).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }